

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ver.c
# Opt level: O0

char * verOS(void)

{
  return "Linux";
}

Assistant:

static const char* verOS()
{
#if defined(OS_WIN)
	return "Windows";
#elif defined(OS_UNIX)
	#if defined(OS_LINUX)	
		return "Linux";
	#elif defined(OS_APPLE)
		return "Apple";
	#else
		return "UNIX";
	#endif
#else 
	return "unknown";
#endif
}